

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::labelled_statement::~labelled_statement(labelled_statement *this)

{
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__labelled_statement_001c7960;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->s_);
  std::__cxx11::wstring::~wstring((wstring *)&this->id_);
  syntax_node::~syntax_node((syntax_node *)this);
  return;
}

Assistant:

explicit labelled_statement(const source_extend& extend, const std::wstring& id, statement_ptr&& s) : statement(extend), id_(id), s_(std::move(s)) {
        assert(!id_.empty());
        assert(s_);
    }